

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
google::protobuf::FatalException::FatalException
          (FatalException *this,char *filename,int line,string *message)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__FatalException_00670798;
  this->filename_ = filename;
  this->line_ = line;
  (this->message_)._M_dataplus._M_p = (pointer)&(this->message_).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message_,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

FatalException(const char* filename, int line, const std::string& message)
      : filename_(filename), line_(line), message_(message) {}